

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.inc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::OneofTest_SwapWithEmpty_Test::
~OneofTest_SwapWithEmpty_Test(OneofTest_SwapWithEmpty_Test *this)

{
  OneofTest_SwapWithEmpty_Test *this_local;
  
  ~OneofTest_SwapWithEmpty_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(OneofTest, SwapWithEmpty) {
  UNITTEST::TestOneof2 message1, message2;
  message1.set_foo_string("FOO");
  EXPECT_TRUE(message1.has_foo_string());
  message1.Swap(&message2);
  EXPECT_FALSE(message1.has_foo_string());
  EXPECT_TRUE(message2.has_foo_string());
  EXPECT_EQ(message2.foo_string(), "FOO");
}